

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O3

void google::protobuf::CheckFieldIndex(FieldDescriptor *field,int index)

{
  byte bVar1;
  ushort *puVar2;
  bool bVar3;
  undefined8 extraout_RAX;
  string_view str;
  string_view str_00;
  string_view v;
  string_view str_01;
  string_view str_02;
  string_view v_00;
  LogMessage local_20;
  
  if (field != (FieldDescriptor *)0x0) {
    bVar1 = field->field_0x1;
    bVar3 = (bool)((bVar1 & 0x20) >> 5);
    if (0xbf < bVar1 != bVar3) {
      CheckFieldIndex();
      absl::lts_20250127::log_internal::LogMessageDebugFatal::~LogMessageDebugFatal
                ((LogMessageDebugFatal *)&local_20);
      _Unwind_Resume(extraout_RAX);
    }
    if (index == -1 && (bVar1 & 0x20) != 0) {
      absl::lts_20250127::log_internal::LogMessageDebugFatal::LogMessageDebugFatal
                ((LogMessageDebugFatal *)&local_20,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/text_format.cc"
                 ,0xc4);
      str._M_str = "Index must be in range of repeated field values. ";
      str._M_len = 0x31;
      absl::lts_20250127::log_internal::LogMessage::
      CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                (&local_20,str);
      str_00._M_str = "Field: ";
      str_00._M_len = 7;
      absl::lts_20250127::log_internal::LogMessage::
      CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                (&local_20,str_00);
      puVar2 = (ushort *)(field->all_names_).payload_;
      v._M_len = (ulong)*puVar2;
      v._M_str = (char *)((long)puVar2 + ~v._M_len);
      absl::lts_20250127::log_internal::LogMessage::operator<<(&local_20,v);
    }
    else {
      if (index == -1 || bVar3 != false) {
        return;
      }
      absl::lts_20250127::log_internal::LogMessageDebugFatal::LogMessageDebugFatal
                ((LogMessageDebugFatal *)&local_20,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/text_format.cc"
                 ,199);
      str_01._M_str = "Index must be -1 for singular fields.";
      str_01._M_len = 0x25;
      absl::lts_20250127::log_internal::LogMessage::
      CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                (&local_20,str_01);
      str_02._M_str = "Field: ";
      str_02._M_len = 7;
      absl::lts_20250127::log_internal::LogMessage::
      CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                (&local_20,str_02);
      puVar2 = (ushort *)(field->all_names_).payload_;
      v_00._M_len = (ulong)*puVar2;
      v_00._M_str = (char *)((long)puVar2 + ~v_00._M_len);
      absl::lts_20250127::log_internal::LogMessage::operator<<(&local_20,v_00);
    }
    absl::lts_20250127::log_internal::LogMessageDebugFatal::~LogMessageDebugFatal
              ((LogMessageDebugFatal *)&local_20);
  }
  return;
}

Assistant:

void CheckFieldIndex(const FieldDescriptor* field, int index) {
  if (field == nullptr) {
    return;
  }

  if (field->is_repeated() && index == -1) {
    ABSL_DLOG(FATAL) << "Index must be in range of repeated field values. "
                     << "Field: " << field->name();
  } else if (!field->is_repeated() && index != -1) {
    ABSL_DLOG(FATAL) << "Index must be -1 for singular fields."
                     << "Field: " << field->name();
  }
}